

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

void google::protobuf::compiler::cpp::GenerateUtf8CheckCode
               (FieldDescriptor *field,Options *options,bool for_parse,char *parameters,
               char *strict_function,char *verify_function,Formatter *format)

{
  FileOptions_OptimizeMode FVar1;
  char cVar2;
  char *format_00;
  char *local_30;
  char *local_28;
  
  cVar2 = '\0';
  local_30 = strict_function;
  local_28 = verify_function;
  if ((*(FileDescriptor **)(field + 0x10))[0x3a] != (FileDescriptor)0x3) {
    FVar1 = GetOptimizeFor(*(FileDescriptor **)(field + 0x10),options,(bool *)0x0);
    cVar2 = (FVar1 == FileOptions_OptimizeMode_LITE_RUNTIME) + '\x01';
  }
  if (cVar2 == '\x01') {
    Formatter::operator()(format,"::$proto_ns$::internal::WireFormat::$1$(\n",&local_28);
    io::Printer::Indent(format->printer_);
    Formatter::operator()<>(format,parameters);
    format_00 = "::$proto_ns$::internal::WireFormat::SERIALIZE,\n";
    if (for_parse) {
      format_00 = "::$proto_ns$::internal::WireFormat::PARSE,\n";
    }
    Formatter::operator()<>(format,format_00);
    Formatter::operator()
              (format,"\"$1$\");\n",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (*(long *)(field + 8) + 0x20));
  }
  else {
    if (cVar2 != '\0') {
      return;
    }
    if (for_parse) {
      Formatter::operator()<>(format,"DO_(");
      Formatter::operator()(format,"::$proto_ns$::internal::WireFormatLite::$1$(\n",&local_30);
      io::Printer::Indent(format->printer_);
      Formatter::operator()<>(format,parameters);
      Formatter::operator()<>(format,"::$proto_ns$::internal::WireFormatLite::PARSE,\n");
      Formatter::operator()
                (format,"\"$1$\")",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(long *)(field + 8) + 0x20));
      Formatter::operator()<>(format,")");
    }
    else {
      Formatter::operator()(format,"::$proto_ns$::internal::WireFormatLite::$1$(\n",&local_30);
      io::Printer::Indent(format->printer_);
      Formatter::operator()<>(format,parameters);
      Formatter::operator()<>(format,"::$proto_ns$::internal::WireFormatLite::SERIALIZE,\n");
      Formatter::operator()
                (format,"\"$1$\")",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(long *)(field + 8) + 0x20));
    }
    Formatter::operator()<>(format,";\n");
  }
  io::Printer::Outdent(format->printer_);
  return;
}

Assistant:

static void GenerateUtf8CheckCode(const FieldDescriptor* field,
                                  const Options& options, bool for_parse,
                                  const char* parameters,
                                  const char* strict_function,
                                  const char* verify_function,
                                  const Formatter& format) {
  switch (GetUtf8CheckMode(field, options)) {
    case Utf8CheckMode::kStrict: {
      if (for_parse) {
        format("DO_(");
      }
      format("::$proto_ns$::internal::WireFormatLite::$1$(\n", strict_function);
      format.Indent();
      format(parameters);
      if (for_parse) {
        format("::$proto_ns$::internal::WireFormatLite::PARSE,\n");
      } else {
        format("::$proto_ns$::internal::WireFormatLite::SERIALIZE,\n");
      }
      format("\"$1$\")", field->full_name());
      if (for_parse) {
        format(")");
      }
      format(";\n");
      format.Outdent();
      break;
    }
    case Utf8CheckMode::kVerify: {
      format("::$proto_ns$::internal::WireFormat::$1$(\n", verify_function);
      format.Indent();
      format(parameters);
      if (for_parse) {
        format("::$proto_ns$::internal::WireFormat::PARSE,\n");
      } else {
        format("::$proto_ns$::internal::WireFormat::SERIALIZE,\n");
      }
      format("\"$1$\");\n", field->full_name());
      format.Outdent();
      break;
    }
    case Utf8CheckMode::kNone:
      break;
  }
}